

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

bool __thiscall QMdi::ControlLabel::event(ControlLabel *this,QEvent *event)

{
  short sVar1;
  long lVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QStyleOptionTitleBar options;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 0x6e) {
    options.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    options._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    options.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.styleObject =
         (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.palette.d =
         (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionTitleBar::QStyleOptionTitleBar(&options);
    QStyleOption::initFrom((QStyleOption *)&options,&this->super_QWidget);
    showToolTip((QHelpEvent *)event,&this->super_QWidget,&options.super_QStyleOptionComplex,
                CC_TitleBar,SC_ComboBoxFrame);
    QStyleOptionTitleBar::~QStyleOptionTitleBar(&options);
  }
  else if (sVar1 == 100) {
    updateWindowIcon(this);
    options.super_QStyleOptionComplex.super_QStyleOption._0_8_ = QPixmap::size();
    QWidget::setFixedSize(&this->super_QWidget,(QSize *)&options);
  }
  else if (sVar1 == 0x22) {
    updateWindowIcon(this);
  }
  bVar3 = QWidget::event(&this->super_QWidget,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool ControlLabel::event(QEvent *event)
{
    if (event->type() == QEvent::WindowIconChange)
        updateWindowIcon();
    else if (event->type() == QEvent::StyleChange) {
        updateWindowIcon();
        setFixedSize(label.size());
    }
#if QT_CONFIG(tooltip)
    else if (event->type() == QEvent::ToolTip) {
        QStyleOptionTitleBar options;
        options.initFrom(this);
        showToolTip(static_cast<QHelpEvent *>(event), this, options,
                    QStyle::CC_TitleBar, QStyle::SC_TitleBarSysMenu);
    }
#endif
    return QWidget::event(event);
}